

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O3

long cfgfile::format_t<long,_cfgfile::wstring_trait_t>::from_string
               (parser_info_t<cfgfile::wstring_trait_t> *info,string_t *value)

{
  int iVar1;
  wchar_t *__nptr;
  int *piVar2;
  long lVar3;
  exception_t<cfgfile::wstring_trait_t> *this;
  long lVar4;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1b0;
  string_t local_190;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_170;
  string_t local_150;
  string_t local_130;
  string_t local_110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  __nptr = (value->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = wcstol(__nptr,(wchar_t **)&local_1b0,10);
  lVar4 = (long)local_1b0._M_dataplus._M_p - (long)__nptr;
  if (lVar4 == 0) {
    std::__throw_invalid_argument("stol");
  }
  else if (*piVar2 != 0x22) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (lVar4 >> 2 == value->_M_string_length) {
      return lVar3;
    }
    goto LAB_00125bc8;
  }
  std::__throw_out_of_range("stol");
LAB_00125bc8:
  this = (exception_t<cfgfile::wstring_trait_t> *)__cxa_allocate_exception(0x30);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Invalid value: \"","");
  wstring_trait_t::from_ascii(&local_110,&local_230);
  std::operator+(&local_f0,&local_110,value);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\". In file \"","");
  wstring_trait_t::from_ascii(&local_130,&local_1d0);
  std::operator+(&local_d0,&local_f0,&local_130);
  std::operator+(&local_b0,&local_d0,&info->m_file_name);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\" on line ","");
  wstring_trait_t::from_ascii(&local_150,&local_1f0);
  std::operator+(local_90,&local_b0,&local_150);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_170,vswprintf,0x20,L"%ld",info->m_line_number);
  std::operator+(&local_1b0,local_90,&local_170);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,".","");
  wstring_trait_t::from_ascii(&local_190,&local_210);
  std::operator+(&local_50,&local_1b0,&local_190);
  exception_t<cfgfile::wstring_trait_t>::exception_t(this,&local_50);
  __cxa_throw(this,&exception_t<cfgfile::wstring_trait_t>::typeinfo,
              exception_t<cfgfile::wstring_trait_t>::~exception_t);
}

Assistant:

static long from_string( const parser_info_t< wstring_trait_t > & info,
		const wstring_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			long result = std::stol( value, &pos );

			if( pos != value.length() )
				throw exception_t< wstring_trait_t >(
					wstring_trait_t::from_ascii( "Invalid value: \"" ) +
					value + wstring_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					wstring_trait_t::from_ascii( "\" on line " ) +
					wstring_trait_t::to_string( info.line_number() ) +
					wstring_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< wstring_trait_t >(
				wstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + wstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				wstring_trait_t::from_ascii( "\" on line " ) +
				wstring_trait_t::to_string( info.line_number() ) +
				wstring_trait_t::from_ascii( "." ) );
		}
	}